

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O0

void __thiscall
Assembler::instr5Bytes(Assembler *this,string *instrDescr,int regsDescr,int addrMode,int value)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  value_type local_29;
  value_type local_28;
  value_type local_27;
  value_type local_26;
  value_type local_25;
  int local_24;
  int local_20;
  int value_local;
  int addrMode_local;
  int regsDescr_local;
  string *instrDescr_local;
  Assembler *this_local;
  
  local_24 = value;
  local_20 = addrMode;
  value_local = regsDescr;
  _addrMode_local = instrDescr;
  instrDescr_local = &this->inputFileName;
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->instrDescription,instrDescr);
  local_25 = (value_type)*pmVar2;
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_25);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  local_26 = (value_type)value_local;
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_26);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  local_27 = (value_type)local_20;
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_27);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  local_28 = (value_type)local_24;
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_28);
  pmVar1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
           ::operator[](&this->codeBySection,&currentSectionName_abi_cxx11_);
  local_29 = (value_type)((uint)local_24 >> 8);
  std::vector<char,_std::allocator<char>_>::push_back(pmVar1,&local_29);
  return;
}

Assistant:

void Assembler::instr5Bytes(string instrDescr, int regsDescr, int addrMode, int value) {

    codeBySection[currentSectionName].push_back(instrDescription[instrDescr]);
    codeBySection[currentSectionName].push_back(regsDescr);
    codeBySection[currentSectionName].push_back(addrMode);
    codeBySection[currentSectionName].push_back(value & 0xff);
    codeBySection[currentSectionName].push_back((value >> 8) & 0xff);


    return;

}